

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void cf_logger_write(cf_logger_t *self,cf_char_t *filename,cf_int_t line,cf_char_t *func,
                    cf_log_level_t level,cf_char_t *fmt,...)

{
  cf_char_t *pcVar1;
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_558 [48];
  undefined8 local_528;
  undefined8 local_518;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  cf_uint_t local_4a0;
  cf_uint_t local_49c;
  cf_uint_t tid;
  cf_uint_t pid;
  va_list args;
  char local_478 [8];
  cf_char_t buf [1024];
  cf_logger_sink_t *sink;
  cf_list_iter_t it;
  cf_char_t *fmt_local;
  cf_log_level_t level_local;
  cf_char_t *func_local;
  cf_int_t line_local;
  cf_char_t *filename_local;
  cf_logger_t *self_local;
  
  if (in_AL != '\0') {
    local_528 = in_XMM0_Qa;
    local_518 = in_XMM1_Qa;
    local_508 = in_XMM2_Qa;
    local_4f8 = in_XMM3_Qa;
    local_4e8 = in_XMM4_Qa;
    local_4d8 = in_XMM5_Qa;
    local_4c8 = in_XMM6_Qa;
    local_4b8 = in_XMM7_Qa;
  }
  memset(local_478,0,0x400);
  local_49c = cf_getpid();
  local_4a0 = cf_gettid();
  args[0].overflow_arg_area = local_558;
  args[0]._0_8_ = &stack0x00000008;
  pid = 0x30;
  tid = 0x30;
  vsprintf(local_478,fmt,&tid);
  for (sink = (cf_logger_sink_t *)(self->sinks).next; sink != (cf_logger_sink_t *)self;
      sink = (cf_logger_sink_t *)sink->write) {
    pcVar1 = sink->type;
    if (((pcVar1 != (cf_char_t *)0x0) && (*(long *)(pcVar1 + 0x10) != 0)) && (self->level <= level))
    {
      (**(code **)(pcVar1 + 0x10))
                (*(undefined8 *)(pcVar1 + 8),local_49c,local_4a0,filename,line,func,level,local_478)
      ;
    }
  }
  return;
}

Assistant:

void cf_logger_write(
    cf_logger_t*        self,
    const cf_char_t*    filename,
    cf_int_t            line,
    const cf_char_t*    func,
    cf_log_level_t      level,
    const cf_char_t*    fmt,
                        ...
) {
    cf_list_iter_t it;
    cf_logger_sink_t* sink = CF_NULL_PTR;
    cf_char_t buf[1024] = {0};
    va_list args;
    cf_uint_t pid = cf_getpid();
    cf_uint_t tid = cf_gettid();

    va_start(args, fmt);
    vsprintf(buf, fmt, args);
    va_end(args);

    for (it = cf_list_iter_init(&self->sinks); !cf_list_iter_end(&self->sinks, it); it = cf_list_iter_next(it)) {
        sink = CF_TYPE_CAST(cf_logger_sink_t*, cf_list_iter_data(it));
        if (sink && sink->write && level >= self->level) {
            sink->write(sink->instance, pid, tid, filename, line, func, level, buf);
        }
    }
}